

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  unsigned_long uVar5;
  ostream *poVar6;
  size_type sVar7;
  MultiANN *this;
  undefined8 *puVar8;
  ulong uVar9;
  value_type *in_stack_fffffffffffffc08;
  ostream *in_stack_fffffffffffffc10;
  ANNpoint in_stack_fffffffffffffc18;
  int *in_stack_fffffffffffffc20;
  int iVar10;
  ANNpoint in_stack_fffffffffffffc28;
  undefined1 *puVar11;
  MultiANN *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc88;
  int *in_stack_fffffffffffffc90;
  int local_318;
  int best_neighbor_index;
  int i_4;
  int i_3;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  ulong uStack_2f8;
  int i_2;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  ulong uStack_2e0;
  int i_1;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined8 local_2c8;
  double d_ann_1;
  double d_degrees;
  ANNpoint result_pt;
  double dStack_2a8;
  int idx_ann;
  double d_ann;
  ANNpoint query_pt;
  int j;
  MultiANN MAG;
  int MaxNeighbors;
  double scale [4];
  double _scale;
  int topology [4];
  ANNpointArray data_points;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  vector<double_*,_std::allocator<double_*>_> pointers_to_points;
  ANNpoint first_point;
  int dimension;
  int max_points;
  undefined1 local_b0 [8];
  vector<Quaternion,_std::allocator<Quaternion>_> cloud;
  string local_90 [39];
  allocator local_69;
  string local_68 [48];
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  if (argc == 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Loading the quaternion file from disk...");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"simple_0.qua",&local_69);
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    if (argc != 2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Wrong number of arguments!");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pcVar2 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,pcVar2,
               (allocator *)
               ((long)&cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator=(local_38,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&cloud.super__Vector_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::__cxx11::string::string((string *)&dimension,local_38);
  load_quaternion_cloud((string *)MAG.AnnArray[0x19]);
  std::__cxx11::string::~string((string *)&dimension);
  sVar7 = std::vector<Quaternion,_std::allocator<Quaternion>_>::size
                    ((vector<Quaternion,_std::allocator<Quaternion>_> *)local_b0);
  pointers_to_points.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Quaternion,_std::allocator<Quaternion>_>::operator[]
                          ((vector<Quaternion,_std::allocator<Quaternion>_> *)local_b0,0);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            ((vector<double_*,_std::allocator<double_*>_> *)0x1071e1);
  for (local_fc = 0; local_fc < (int)sVar7; local_fc = local_fc + 1) {
    std::vector<double_*,_std::allocator<double_*>_>::push_back
              ((vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
  }
  std::vector<double_*,_std::allocator<double_*>_>::operator[]
            ((vector<double_*,_std::allocator<double_*>_> *)local_f8,0);
  poVar6 = std::operator<<((ostream *)&std::cout,"Creating the search data structure...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  MAG.AnnArray[0x1e]._4_4_ = 0x10;
  MultiANN::MultiANN(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                     (int)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc18);
  for (query_pt._4_4_ = 0; query_pt._4_4_ < (int)sVar7; query_pt._4_4_ = query_pt._4_4_ + 1) {
    MultiANN::AddPoint(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20
                      );
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Generating Random Query Point");
  iVar10 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  this = (MultiANN *)annAllocPt(iVar10,(ANNcoord)in_stack_fffffffffffffc18);
  *(ANNcoord *)this = 0.0;
  *(undefined8 *)&this->LastNodeCount = 0;
  this->points_coor = (ANNpointArray)0x0;
  this->points_ptr = (void **)0x3ff0000000000000;
  d_ann = (double)this;
  poVar6 = std::operator<<((ostream *)&std::cout,"Calling single point nearest neighbor...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  dStack_2a8 = INFINITY;
  d_degrees = (double)MultiANN::NearestNeighbor
                                (this,(ANNpoint *)poVar6,in_stack_fffffffffffffc90,
                                 in_stack_fffffffffffffc88);
  std::operator<<((ostream *)&std::cout,"query_pt = ");
  printPt(in_stack_fffffffffffffc10,(ANNpoint)in_stack_fffffffffffffc08,0);
  std::operator<<((ostream *)&std::cout,"result_pt = ");
  printPt(in_stack_fffffffffffffc10,(ANNpoint)in_stack_fffffffffffffc08,0);
  poVar6 = std::operator<<((ostream *)&std::cout,"ANN distance = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dStack_2a8);
  poVar6 = std::operator<<(poVar6," rad");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  d_ann_1 = (dStack_2a8 * 180.0) / 3.141592653589793;
  poVar6 = std::operator<<((ostream *)&std::cout,"ANN distance = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,d_ann_1);
  poVar6 = std::operator<<(poVar6," degrees");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Calling multiple point nearest neighbor...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_2c8 = 0x7ff0000000000000;
  __vla_expr0 = (unsigned_long)&stack0xfffffffffffffc08;
  lVar3 = -0x3f8 - ((ulong)MAG.AnnArray[0x1e]._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  __vla_expr1 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  lVar4 = lVar3 - ((ulong)MAG.AnnArray[0x1e]._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  uStack_2e0 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  for (__vla_expr2._4_4_ = 0; __vla_expr2._4_4_ < (int)MAG.AnnArray[0x1e]._4_4_;
      __vla_expr2._4_4_ = __vla_expr2._4_4_ + 1) {
    *(undefined1 **)(&stack0xfffffffffffffc08 + (long)__vla_expr2._4_4_ * 8 + lVar4 + 0x3f8) =
         &stack0xfffffffffffffc08 + (long)__vla_expr2._4_4_ * 8 + lVar3 + 0x3f8;
  }
  puVar11 = &stack0xfffffffffffffc08 +
            (lVar4 - ((ulong)MAG.AnnArray[0x1e]._4_4_ * 4 + 0xf & 0xfffffffffffffff0)) + 0x3f8;
  __vla_expr3 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  uVar9 = (ulong)MAG.AnnArray[0x1e]._4_4_ * 8 + 0xf & 0xfffffffffffffff0;
  uStack_2f8 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  for (__vla_expr4._4_4_ = 0; __vla_expr4._4_4_ < (int)MAG.AnnArray[0x1e]._4_4_;
      __vla_expr4._4_4_ = __vla_expr4._4_4_ + 1) {
    *(undefined1 **)(puVar11 + ((long)__vla_expr4._4_4_ * 8 - uVar9)) =
         puVar11 + (long)__vla_expr4._4_4_ * 4;
  }
  lVar4 = -((ulong)MAG.AnnArray[0x1e]._4_4_ * 8 + 0xf & 0xfffffffffffffff0) - uVar9;
  __vla_expr5 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  puVar8 = (undefined8 *)
           (puVar11 + (lVar4 - ((ulong)MAG.AnnArray[0x1e]._4_4_ * 8 + 0xf & 0xfffffffffffffff0)));
  _i_4 = (ulong)MAG.AnnArray[0x1e]._4_4_;
  for (best_neighbor_index = 0; best_neighbor_index < (int)MAG.AnnArray[0x1e]._4_4_;
      best_neighbor_index = best_neighbor_index + 1) {
    puVar8[best_neighbor_index] = puVar11 + (long)best_neighbor_index * 8 + lVar4;
  }
  puVar8[-1] = 0x107886;
  MultiANN::NearestNeighbor
            ((MultiANN *)puVar8[0x21],(ANNpoint *)puVar8[0x20],(ANNpoint *)puVar8[0x1f],
             (int **)puVar8[0x1e],(void ***)puVar8[0x1d]);
  puVar8[-1] = 0x10789b;
  poVar6 = std::operator<<((ostream *)&std::cout,"Nearest Neighbors:");
  puVar8[-1] = 0x1078b7;
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_318 = 0; uVar5 = __vla_expr0, local_318 < (int)MAG.AnnArray[0x1e]._4_4_;
      local_318 = local_318 + 1) {
    iVar10 = *(int *)(puVar11 + (long)local_318 * 4);
    dVar1 = *(double *)(&stack0xfffffffffffffc08 + (long)local_318 * 8 + lVar3 + 0x3f8);
    puVar8[-1] = 0x107923;
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(dVar1 * 180.0) / 3.141592653589793);
    puVar8[-1] = 0x10793f;
    std::operator<<(poVar6," deg: ");
    puVar8[-1] = 0x107954;
    std::vector<double_*,_std::allocator<double_*>_>::operator[]
              ((vector<double_*,_std::allocator<double_*>_> *)local_f8,(long)iVar10);
    puVar8[-1] = 0x107969;
    printPt((ostream *)puVar8[1],(ANNpoint)*puVar8,*(int *)((long)puVar8 + -4));
  }
  *(undefined8 *)(__vla_expr0 - 8) = 0x107997;
  MultiANN::~MultiANN(*(MultiANN **)(uVar5 + 0x18));
  *(undefined8 *)(uVar5 - 8) = 0x1079a3;
  std::vector<double_*,_std::allocator<double_*>_>::~vector
            (*(vector<double_*,_std::allocator<double_*>_> **)(uVar5 + 0x18));
  *(undefined8 *)(uVar5 - 8) = 0x1079af;
  std::vector<Quaternion,_std::allocator<Quaternion>_>::~vector
            (*(vector<Quaternion,_std::allocator<Quaternion>_> **)(uVar5 + 0x18));
  *(undefined8 *)(uVar5 - 8) = 0x1079b8;
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    string filename;
    switch (argc) {
        case 1:
            cout << "Loading the quaternion file from disk..." << endl;
            filename = string("simple_0.qua");
            break;
        case 2:
            filename = string(argv[1]);
            break;
        default:
            cout << "Wrong number of arguments!" << endl;
            exit(EXIT_FAILURE);
    }
    auto cloud = load_quaternion_cloud(filename);

    int max_points = cloud.size();      // maximum number of data points
    int dimension = 4;            
    ANNpoint first_point = &(cloud[0].p[0]); 
    vector<double*> pointers_to_points;
    // ANN requires an entire vector of pointers even if the array is dense!
    for (int i = 0; i < max_points; i++) {
        pointers_to_points.push_back(first_point + 4*i);
    }
    ANNpointArray data_points = &pointers_to_points[0]; 

    cout << "Creating the search data structure..." << endl;
    int topology[] = {3, 3, 3, 3}; // Code for a single quaternion
    double _scale = 1.0;
    double scale[] = {_scale, _scale, _scale, _scale};
    int MaxNeighbors = 16;  // number of nearest neighbors
    MultiANN MAG(dimension, MaxNeighbors, topology, scale);
    for (int j = 0; j < max_points; j++) {
      MAG.AddPoint(data_points[j], data_points[j]);  
    }

    cout << "Generating Random Query Point" << endl;
    ANNpoint query_pt = annAllocPt(dimension);          // allocate query point
    //randomDistPoint(dimension, topology, query_pt);
    query_pt[0] = 0.0;
    query_pt[1] = 0.0;
    query_pt[2] = 0.0;
    query_pt[3] = 1.0;

    {
        cout << "Calling single point nearest neighbor..." << endl;
        double d_ann = INFINITY;
        int idx_ann;
        auto result_pt = (ANNpoint)MAG.NearestNeighbor(
            query_pt, idx_ann, d_ann);  // single nearest neighbor
        printPt(cout << "query_pt = ", query_pt, dimension);
        printPt(cout << "result_pt = ", result_pt, dimension);
        cout << "ANN distance = " << d_ann << " rad" << endl;
        double d_degrees = d_ann * 180.0 / PI;
        cout << "ANN distance = " << d_degrees << " degrees" << endl;
    }
    {
        cout << "Calling multiple point nearest neighbor..." << endl;
        double d_ann = INFINITY;

        double best_dist[MaxNeighbors];
        ANNpoint p_best_dist[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_dist[i] = best_dist+i;

        int best_neighbor_indeces[MaxNeighbors];
        int* p_best_neighbor_indeces[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_neighbor_indeces[i] = best_neighbor_indeces+i;
        void *best_ptr[MaxNeighbors];
        void **p_best_ptr[MaxNeighbors];
        for(int i=0; i<MaxNeighbors; i++) p_best_ptr[i] = best_ptr+i;
        MAG.NearestNeighbor(query_pt, p_best_dist[0], p_best_neighbor_indeces[0],
                            p_best_ptr[0]);  // multiple nearest neighbor

        cout << "Nearest Neighbors:" << endl;
        for(int i=0; i<MaxNeighbors; i++)
        {
          int best_neighbor_index = best_neighbor_indeces[i];
          //cout << "best_neighbor_index = " << best_neighbor_index << endl;
          cout << best_dist[i]*180.0/PI << " deg: ";
          printPt(cout, pointers_to_points[best_neighbor_index], dimension);
        }

    }
}